

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O2

sexp_conflict sexp_closedir_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict x)

{
  if ((x->field_0x5 & 2) != 0) {
    closedir((DIR *)(x->value).type.slots);
    x->field_0x5 = x->field_0x5 & 0xfd;
  }
  return (sexp_conflict)0x43e;
}

Assistant:

sexp sexp_closedir_stub (sexp ctx, sexp self, sexp_sint_t n, sexp x) {
  if (sexp_cpointer_freep(x)) {
    closedir(
#ifdef __cplusplus
(DIR*)
#endif
sexp_cpointer_value(x));
    sexp_cpointer_freep(x) = 0;
  }
  return SEXP_VOID;
}